

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point2f __thiscall pbrt::detail::Stratified2DIter::operator*(Stratified2DIter *this)

{
  int iVar1;
  undefined4 uVar2;
  ulong uVar3;
  uint64_t uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  uint64_t oldstate;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  iVar1 = (this->super_RNGIterator<pbrt::detail::Stratified2DIter>).
          super_IndexingIterator<pbrt::detail::Stratified2DIter>.i;
  uVar3 = (this->super_RNGIterator<pbrt::detail::Stratified2DIter>).rng.state;
  uVar4 = (this->super_RNGIterator<pbrt::detail::Stratified2DIter>).rng.inc;
  uVar7 = uVar3 * 0x5851f42d4c957f2d + uVar4;
  (this->super_RNGIterator<pbrt::detail::Stratified2DIter>).rng.state =
       uVar7 * 0x5851f42d4c957f2d + uVar4;
  uVar2 = this->nx;
  uVar5 = this->ny;
  auVar12._4_4_ = uVar5;
  auVar12._0_4_ = uVar2;
  auVar6 = vpinsrd_avx(ZEXT416((uint)(iVar1 % (int)uVar2)),iVar1 / (int)uVar2,1);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar7;
  auVar10 = vpunpcklqdq_avx(auVar9,auVar13);
  auVar8 = vpsrlvq_avx2(auVar10,_DAT_005c85b0);
  auVar9 = vpsrlvq_avx2(auVar10,_DAT_005c85c0);
  auVar8 = vpshufd_avx(auVar8 ^ auVar9,0xe8);
  auVar10 = vpsrlq_avx(auVar10,0x3b);
  auVar10 = vpshufd_avx(auVar10,0xe8);
  auVar8 = vprorvd_avx512vl(auVar8,auVar10);
  auVar10 = vcvtudq2ps_avx512vl(auVar8);
  auVar8._8_4_ = 0x2f800000;
  auVar8._0_8_ = 0x2f8000002f800000;
  auVar8._12_4_ = 0x2f800000;
  auVar8 = vmulps_avx512vl(auVar10,auVar8);
  auVar10._8_4_ = 0x3f7fffff;
  auVar10._0_8_ = 0x3f7fffff3f7fffff;
  auVar10._12_4_ = 0x3f7fffff;
  auVar8 = vminps_avx512vl(auVar8,auVar10);
  auVar11._0_4_ = auVar8._0_4_ + auVar6._0_4_;
  auVar11._4_4_ = auVar8._4_4_ + auVar6._4_4_;
  auVar11._8_4_ = auVar8._8_4_ + auVar6._8_4_;
  auVar11._12_4_ = auVar8._12_4_ + auVar6._12_4_;
  auVar12._8_8_ = 0;
  auVar6 = vcvtdq2ps_avx(auVar12);
  auVar6 = vdivps_avx(auVar11,auVar6);
  return (Point2f)auVar6._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() {
        int ix = i % nx, iy = i / nx;
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny};
    }